

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O2

void ProcessRow_SSE2(__m128i *A0,__m128i *A1,__m128i *A2,__m128i *A3,__m128i *mult,uint8_t *dst)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  uVar9 = (*mult)[0];
  uVar10 = (*mult)[1];
  auVar13._0_8_ = ((*A2)[0] & 0xffffffffU) * (uVar9 & 0xffffffff) + 0x80000000;
  auVar13._8_8_ = ((*A2)[1] & 0xffffffffU) * (uVar10 & 0xffffffff) + 0x80000000;
  auVar14._0_8_ = (uVar9 & 0xffffffff) * (ulong)(uint)(*A3)[0] + 0x80000000;
  auVar14._8_8_ = (uVar10 & 0xffffffff) * (ulong)(uint)(*A3)[1] + 0x80000000;
  auVar11._0_8_ = ((*A0)[0] & 0xffffffffU) * (uVar9 & 0xffffffff) + 0x80000000 >> 0x20;
  auVar11._8_8_ = ((*A0)[1] & 0xffffffffU) * (uVar10 & 0xffffffff) + 0x80000000 >> 0x20;
  auVar12._0_8_ = ((*A1)[0] & 0xffffffffU) * (uVar9 & 0xffffffff) + 0x80000000 >> 0x20;
  auVar12._8_8_ = ((*A1)[1] & 0xffffffffU) * (uVar10 & 0xffffffff) + 0x80000000 >> 0x20;
  auVar14 = packssdw(auVar13 & _DAT_0013fcf0 | auVar11,auVar14 & _DAT_0013fcf0 | auVar12);
  sVar1 = auVar14._0_2_;
  sVar2 = auVar14._2_2_;
  sVar3 = auVar14._4_2_;
  sVar4 = auVar14._6_2_;
  sVar5 = auVar14._8_2_;
  sVar6 = auVar14._10_2_;
  sVar7 = auVar14._12_2_;
  sVar8 = auVar14._14_2_;
  *(ulong *)dst =
       CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar14[0xe] - (0xff < sVar8),
                CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar14[0xc] - (0xff < sVar7),
                         CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar14[10] - (0xff < sVar6),
                                  CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar14[8] -
                                           (0xff < sVar5),
                                           CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar14[6] -
                                                    (0xff < sVar4),
                                                    CONCAT12((0 < sVar3) * (sVar3 < 0x100) *
                                                             auVar14[4] - (0xff < sVar3),
                                                             CONCAT11((0 < sVar2) * (sVar2 < 0x100)
                                                                      * auVar14[2] - (0xff < sVar2),
                                                                      (0 < sVar1) * (sVar1 < 0x100)
                                                                      * auVar14[0] - (0xff < sVar1))
                                                            ))))));
  return;
}

Assistant:

static WEBP_INLINE void ProcessRow_SSE2(const __m128i* const A0,
                                        const __m128i* const A1,
                                        const __m128i* const A2,
                                        const __m128i* const A3,
                                        const __m128i* const mult,
                                        uint8_t* const dst) {
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  const __m128i mask = _mm_set_epi32(0xffffffffu, 0, 0xffffffffu, 0);
  const __m128i B0 = _mm_mul_epu32(*A0, *mult);
  const __m128i B1 = _mm_mul_epu32(*A1, *mult);
  const __m128i B2 = _mm_mul_epu32(*A2, *mult);
  const __m128i B3 = _mm_mul_epu32(*A3, *mult);
  const __m128i C0 = _mm_add_epi64(B0, rounder);
  const __m128i C1 = _mm_add_epi64(B1, rounder);
  const __m128i C2 = _mm_add_epi64(B2, rounder);
  const __m128i C3 = _mm_add_epi64(B3, rounder);
  const __m128i D0 = _mm_srli_epi64(C0, WEBP_RESCALER_RFIX);
  const __m128i D1 = _mm_srli_epi64(C1, WEBP_RESCALER_RFIX);
#if (WEBP_RESCALER_RFIX < 32)
  const __m128i D2 =
      _mm_and_si128(_mm_slli_epi64(C2, 32 - WEBP_RESCALER_RFIX), mask);
  const __m128i D3 =
      _mm_and_si128(_mm_slli_epi64(C3, 32 - WEBP_RESCALER_RFIX), mask);
#else
  const __m128i D2 = _mm_and_si128(C2, mask);
  const __m128i D3 = _mm_and_si128(C3, mask);
#endif
  const __m128i E0 = _mm_or_si128(D0, D2);
  const __m128i E1 = _mm_or_si128(D1, D3);
  const __m128i F = _mm_packs_epi32(E0, E1);
  const __m128i G = _mm_packus_epi16(F, F);
  _mm_storel_epi64((__m128i*)dst, G);
}